

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *s,QRectF *r)

{
  QDataStream *pQVar1;
  
  pQVar1 = QDataStream::operator<<(s,r->xp);
  pQVar1 = QDataStream::operator<<(pQVar1,r->yp);
  pQVar1 = QDataStream::operator<<(pQVar1,r->w);
  QDataStream::operator<<(pQVar1,r->h);
  return s;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QRectF &r)
{
    s << double(r.x()) << double(r.y()) << double(r.width()) << double(r.height());
    return s;
}